

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  CAMFImporter_NodeElement_Texture *pCVar4;
  CAMFImporter_NodeElement_Texture *pCVar5;
  pointer puVar6;
  undefined8 pID;
  string *pID_00;
  AMFImporter *this_00;
  _List_node_base *__n;
  bool bVar7;
  int iVar8;
  size_t idx_target;
  long *plVar9;
  _List_node_base *p_Var10;
  runtime_error *prVar11;
  pointer puVar12;
  _Node *p_Var13;
  long *plVar14;
  CAMFImporter_NodeElement_Texture **ppCVar15;
  ulong *puVar16;
  ulong uVar17;
  pointer puVar18;
  CAMFImporter_NodeElement_Texture *pCVar19;
  ulong uVar20;
  _List_node_base *p_Var21;
  CAMFImporter_NodeElement_Texture *pCVar22;
  pointer puVar23;
  size_t sVar24;
  pointer puVar25;
  undefined1 *__s2;
  pointer puVar26;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  CAMFImporter_NodeElement *t_tex;
  SPP_Texture converted_texture;
  string TextureConverted_ID;
  CAMFImporter_NodeElement_Texture **local_198;
  iterator iStack_190;
  CAMFImporter_NodeElement_Texture *local_188;
  long lStack_180;
  string *local_170;
  CAMFImporter_NodeElement_Texture *local_168;
  long local_160;
  undefined1 local_158 [72];
  size_t sStack_110;
  SPP_Texture local_108;
  CAMFImporter_NodeElement_Texture *local_b8;
  string *local_b0;
  AMFImporter *local_a8;
  _List_node_base *local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78;
  _List_node_base *local_70;
  undefined1 local_68 [16];
  size_type local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_78 = local_68;
  local_70 = (_List_node_base *)0x0;
  local_68[0] = 0;
  if ((((pID_R->_M_string_length == 0) && (pID_G->_M_string_length == 0)) &&
      (pID_B->_M_string_length == 0)) && (pID_A->_M_string_length == 0)) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_108.ID._M_dataplus._M_p = (pointer)&local_108.ID.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",
               "");
    std::runtime_error::runtime_error(prVar11,(string *)&local_108);
    *(undefined ***)prVar11 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98[0] = local_88;
  pcVar3 = (pID_R->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + pID_R->_M_string_length);
  std::__cxx11::string::append((char *)local_98);
  local_158._40_8_ = pID_B;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_98,(ulong)(pID_G->_M_dataplus)._M_p);
  plVar14 = plVar9 + 2;
  if ((long *)*plVar9 == plVar14) {
    local_40 = *plVar14;
    lStack_38 = plVar9[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar14;
    local_50 = (long *)*plVar9;
  }
  local_48 = plVar9[1];
  *plVar9 = (long)plVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  pCVar22 = (CAMFImporter_NodeElement_Texture *)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar9 == pCVar22) {
    local_158._64_8_ = (pCVar22->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    sStack_110 = plVar9[3];
    local_158._48_8_ = (CAMFImporter_NodeElement_Texture *)(local_158 + 0x40);
  }
  else {
    local_158._64_8_ = (pCVar22->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_158._48_8_ = (CAMFImporter_NodeElement_Texture *)*plVar9;
  }
  local_158._56_8_ = plVar9[1];
  *plVar9 = (long)pCVar22;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_170 = pID_G;
  local_a8 = this;
  plVar9 = (long *)std::__cxx11::string::_M_append(local_158 + 0x30,*(ulong *)local_158._40_8_);
  ppCVar15 = (CAMFImporter_NodeElement_Texture **)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture **)*plVar9 == ppCVar15) {
    local_188 = *ppCVar15;
    lStack_180 = plVar9[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *ppCVar15;
    local_198 = (CAMFImporter_NodeElement_Texture **)*plVar9;
  }
  iStack_190._M_current = (CAMFImporter_NodeElement_Texture **)plVar9[1];
  *plVar9 = (long)ppCVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_168 = (CAMFImporter_NodeElement_Texture *)local_158;
  pCVar22 = (CAMFImporter_NodeElement_Texture *)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar9 == pCVar22) {
    local_158._0_8_ = (pCVar22->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_158._8_8_ = plVar9[3];
  }
  else {
    local_158._0_8_ = (pCVar22->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_168 = (CAMFImporter_NodeElement_Texture *)*plVar9;
  }
  local_160 = plVar9[1];
  *plVar9 = (long)pCVar22;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_b0 = pID_A;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_168,(ulong)(pID_A->_M_dataplus)._M_p);
  paVar2 = &local_108.ID.field_2;
  puVar16 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_108.ID.field_2._M_allocated_capacity = *puVar16;
    local_108.ID.field_2._8_8_ = plVar9[3];
    local_108.ID._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_108.ID.field_2._M_allocated_capacity = *puVar16;
    local_108.ID._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_108.ID._M_string_length = plVar9[1];
  *plVar9 = (long)puVar16;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.ID._M_dataplus._M_p != paVar2) {
    operator_delete(local_108.ID._M_dataplus._M_p);
  }
  if (local_168 != (CAMFImporter_NodeElement_Texture *)local_158) {
    operator_delete(local_168);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  this_00 = local_a8;
  if ((CAMFImporter_NodeElement_Texture *)local_158._48_8_ !=
      (CAMFImporter_NodeElement_Texture *)(local_158 + 0x40)) {
    operator_delete((void *)local_158._48_8_);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  __n = local_70;
  __s2 = local_78;
  p_Var10 = (_List_node_base *)&this_00->mTexture_Converted;
  p_Var21 = (this_00->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_a0 = p_Var10;
  if (p_Var21 == p_Var10) {
    sVar24 = 0;
  }
  else {
    sVar24 = 0;
    do {
      if ((p_Var21[1]._M_prev == __n) &&
         ((__n == (_List_node_base *)0x0 ||
          (iVar8 = bcmp(p_Var21[1]._M_next,__s2,(size_t)__n), p_Var10 = local_a0, iVar8 == 0))))
      goto LAB_003ccf9b;
      sVar24 = sVar24 + 1;
      p_Var21 = p_Var21->_M_next;
    } while (p_Var21 != p_Var10);
  }
  pID_00 = local_b0;
  pID = local_158._40_8_;
  local_198 = (CAMFImporter_NodeElement_Texture **)0x0;
  iStack_190._M_current = (CAMFImporter_NodeElement_Texture **)0x0;
  pCVar22 = (CAMFImporter_NodeElement_Texture *)0x0;
  local_188 = (CAMFImporter_NodeElement_Texture *)0x0;
  local_108.ID._M_dataplus._M_p = (pointer)&local_108.ID.field_2;
  local_108.ID._M_string_length = 0;
  local_108.ID.field_2._M_allocated_capacity =
       local_108.ID.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pID_R->_M_string_length != 0) {
    bVar7 = Find_NodeElement(this_00,pID_R,ENET_Texture,(CAMFImporter_NodeElement **)&local_168);
    if (!bVar7) {
      Throw_ID_NotFound(this_00,pID_R);
    }
    pCVar22 = local_168;
    local_158._48_8_ = local_168;
    if ((CAMFImporter_NodeElement_Texture *)iStack_190._M_current == local_188) {
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      _M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_198,iStack_190,(CAMFImporter_NodeElement_Texture **)(local_158 + 0x30));
    }
    else {
      *iStack_190._M_current = local_168;
      iStack_190._M_current = iStack_190._M_current + 1;
    }
  }
  if (local_170->_M_string_length == 0) {
    local_158._24_8_ = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar7 = Find_NodeElement(this_00,local_170,ENET_Texture,(CAMFImporter_NodeElement **)&local_168)
    ;
    if (!bVar7) {
      Throw_ID_NotFound(this_00,local_170);
    }
    local_158._48_8_ = local_168;
    local_158._24_8_ = local_168;
    if ((CAMFImporter_NodeElement_Texture *)iStack_190._M_current == local_188) {
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      _M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_198,iStack_190,(CAMFImporter_NodeElement_Texture **)(local_158 + 0x30));
    }
    else {
      *iStack_190._M_current = local_168;
      iStack_190._M_current = iStack_190._M_current + 1;
    }
  }
  if (*(size_type *)(pID + 8) == 0) {
    local_158._16_8_ = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar7 = Find_NodeElement(this_00,(string *)pID,ENET_Texture,
                             (CAMFImporter_NodeElement **)&local_168);
    if (!bVar7) {
      Throw_ID_NotFound(this_00,(string *)pID);
    }
    local_158._48_8_ = local_168;
    local_158._16_8_ = local_168;
    if ((CAMFImporter_NodeElement_Texture *)iStack_190._M_current == local_188) {
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      _M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_198,iStack_190,(CAMFImporter_NodeElement_Texture **)(local_158 + 0x30));
    }
    else {
      *iStack_190._M_current = local_168;
      iStack_190._M_current = iStack_190._M_current + 1;
    }
  }
  if (pID_00->_M_string_length == 0) {
    pCVar19 = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar7 = Find_NodeElement(this_00,pID_00,ENET_Texture,(CAMFImporter_NodeElement **)&local_168);
    if (!bVar7) {
      Throw_ID_NotFound(this_00,pID_00);
    }
    pCVar19 = local_168;
    local_158._48_8_ = local_168;
    if ((CAMFImporter_NodeElement_Texture *)iStack_190._M_current == local_188) {
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      _M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_198,iStack_190,(CAMFImporter_NodeElement_Texture **)(local_158 + 0x30));
    }
    else {
      *iStack_190._M_current = local_168;
      iStack_190._M_current = iStack_190._M_current + 1;
    }
  }
  uVar17 = (long)iStack_190._M_current - (long)local_198 >> 3;
  if (1 < uVar17) {
    uVar20 = 1;
    while (uVar17 != uVar20) {
      pCVar4 = local_198[uVar20 - 1];
      pCVar5 = local_198[uVar20];
      if (((pCVar4->Width != pCVar5->Width) || (pCVar4->Height != pCVar5->Height)) ||
         (uVar20 = uVar20 + 1, pCVar4->Depth != pCVar5->Depth)) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_168 = (CAMFImporter_NodeElement_Texture *)local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,
                   "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                   ,"");
        std::runtime_error::runtime_error(prVar11,(string *)&local_168);
        *(undefined ***)prVar11 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  local_108.Width = (*local_198)->Width;
  local_108.Height = (*local_198)->Height;
  local_108.Depth = (*local_198)->Depth;
  local_108.Tiled = false;
  if (iStack_190._M_current != local_198) {
    uVar20 = 0;
    local_108.Tiled = false;
    do {
      local_108.Tiled = (bool)(local_108.Tiled | local_198[uVar20]->Tiled);
      uVar20 = uVar20 + 1;
    } while ((uVar20 & 0xff) < uVar17);
  }
  builtin_strncpy(local_108.FormatHint,"rgba0000",9);
  local_58 = pID_R->_M_string_length;
  if (local_58 != 0) {
    builtin_strncpy(local_108.FormatHint,"rgba8000",8);
  }
  local_158._32_8_ = local_170->_M_string_length;
  if (local_158._32_8_ != 0) {
    local_108.FormatHint[5] = '8';
  }
  if (*(size_type *)(pID + 8) != 0) {
    local_108.FormatHint[6] = '8';
  }
  if (pID_00->_M_string_length != 0) {
    local_108.FormatHint[7] = '8';
  }
  bVar7 = pCVar22 != (CAMFImporter_NodeElement_Texture *)0x0 && local_58 != 0;
  if (bVar7) {
    puVar18 = (pCVar22->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              -(long)(pCVar22->Data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  else {
    puVar18 = (pointer)0x0;
  }
  puVar26 = (pointer)(ulong)bVar7;
  puVar23 = puVar26;
  if ((CAMFImporter_NodeElement_Texture *)local_158._24_8_ !=
      (CAMFImporter_NodeElement_Texture *)0x0 && local_158._32_8_ != 0) {
    puVar18 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_158._24_8_ + 0x68))
              ->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
              ((long)puVar18 -
              (long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (local_158._24_8_ + 0x68))->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start);
    puVar23 = puVar26 + 1;
  }
  puVar25 = puVar23;
  if ((CAMFImporter_NodeElement_Texture *)local_158._16_8_ !=
      (CAMFImporter_NodeElement_Texture *)0x0 && *(size_type *)(pID + 8) != 0) {
    puVar18 = *(pointer *)(local_158._16_8_ + 0x70) +
              ((long)puVar18 -
              (long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     (local_158._16_8_ + 0x68))->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start);
    puVar25 = puVar23 + 1;
  }
  if (pCVar19 != (CAMFImporter_NodeElement_Texture *)0x0 && pID_00->_M_string_length != 0) {
    puVar18 = (pCVar19->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              ((long)puVar18 -
              (long)(pCVar19->Data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    puVar25 = puVar25 + 1;
  }
  local_b8 = pCVar19;
  local_108.Data = (uint8_t *)operator_new__((ulong)puVar18);
  if ((local_58 != 0) && (puVar18 != (pointer)0x0)) {
    if (pCVar22 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003ccfd3;
    puVar12 = (pointer)0x0;
    uVar17 = 0;
    do {
      puVar6 = (pCVar22->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pCVar22->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar6) <= uVar17)
      goto LAB_003ccfc5;
      local_108.Data[(long)puVar12] = puVar6[uVar17];
      puVar12 = puVar12 + (long)puVar25;
      uVar17 = uVar17 + 1;
    } while (puVar12 < puVar18);
    local_158._32_8_ = local_170->_M_string_length;
  }
  if ((puVar26 < puVar18) && (local_158._32_8_ != 0)) {
    if ((CAMFImporter_NodeElement_Texture *)local_158._24_8_ ==
        (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003ccfd3;
    uVar17 = 0;
    do {
      puVar12 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_158._24_8_ + 0x68)
                 )->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         (local_158._24_8_ + 0x68))->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar12) <= uVar17)
      goto LAB_003ccfc5;
      local_108.Data[(long)puVar26] = puVar12[uVar17];
      puVar26 = puVar26 + (long)puVar25;
      uVar17 = uVar17 + 1;
    } while (puVar26 < puVar18);
  }
  if ((*(size_type *)(local_158._40_8_ + 8) != 0) && (puVar23 < puVar18)) {
    if ((CAMFImporter_NodeElement_Texture *)local_158._16_8_ ==
        (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003ccfd3;
    uVar17 = 0;
    do {
      puVar26 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_158._16_8_ + 0x68)
                 )->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)(local_158._16_8_ + 0x70) - (long)puVar26) <= uVar17)
      goto LAB_003ccfc5;
      local_108.Data[(long)puVar23] = puVar26[uVar17];
      puVar23 = puVar23 + (long)puVar25;
      uVar17 = uVar17 + 1;
    } while (puVar23 < puVar18);
  }
  if ((local_b0->_M_string_length != 0) && (puVar23 = puVar25 + -1, puVar23 < puVar18)) {
    if (local_b8 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003ccfd3;
    uVar17 = 0;
    do {
      puVar26 = (local_b8->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_b8->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar26) <= uVar17)
      goto LAB_003ccfc5;
      local_108.Data[(long)puVar23] = puVar26[uVar17];
      puVar23 = puVar23 + (long)puVar25;
      uVar17 = uVar17 + 1;
    } while (puVar23 < puVar18);
  }
  std::__cxx11::string::_M_assign((string *)&local_108);
  p_Var13 = std::__cxx11::
            list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
            ::_M_create_node<Assimp::AMFImporter::SPP_Texture_const&>
                      ((list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
                        *)local_a0,&local_108);
  std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
  psVar1 = &(local_a8->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.ID._M_dataplus._M_p != &local_108.ID.field_2) {
    operator_delete(local_108.ID._M_dataplus._M_p);
  }
  __s2 = local_78;
  if (local_198 != (CAMFImporter_NodeElement_Texture **)0x0) {
    operator_delete(local_198);
    __s2 = local_78;
  }
LAB_003ccf9b:
  if (__s2 != local_68) {
    operator_delete(__s2);
  }
  return sVar24;
LAB_003ccfc5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_003ccfd3:
  __assert_fail("tex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/AMF/AMFImporter_Postprocess.cpp"
                ,0x120,
                "auto Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string &, const std::string &, const std::string &, const std::string &)::(anonymous class)::operator()(const std::string &, const size_t, const size_t, const uint8_t) const"
               );
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}